

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rootindexproxymodel.cpp
# Opt level: O2

void __thiscall RootIndexProxyModel::~RootIndexProxyModel(RootIndexProxyModel *this)

{
  RootIndexProxyModelPrivate *pRVar1;
  Connection *pCVar2;
  Connection *pCVar3;
  
  *(undefined ***)this = &PTR_metaObject_001682f0;
  pRVar1 = this->m_dptr;
  pCVar2 = (pRVar1->m_sourceConnections).d.ptr;
  for (pCVar3 = pCVar2; pCVar3 != pCVar2 + (pRVar1->m_sourceConnections).d.size; pCVar3 = pCVar3 + 1
      ) {
    QObject::disconnect(pCVar3);
    pCVar2 = (pRVar1->m_sourceConnections).d.ptr;
  }
  pRVar1 = this->m_dptr;
  if (pRVar1 != (RootIndexProxyModelPrivate *)0x0) {
    RootIndexProxyModelPrivate::~RootIndexProxyModelPrivate(pRVar1);
  }
  operator_delete(pRVar1,0x60);
  QIdentityProxyModel::~QIdentityProxyModel(&this->super_QIdentityProxyModel);
  return;
}

Assistant:

RootIndexProxyModel::~RootIndexProxyModel()
{
    Q_D(RootIndexProxyModel);
    for (auto discIter = d->m_sourceConnections.cbegin(); discIter != d->m_sourceConnections.cend(); ++discIter)
        QObject::disconnect(*discIter);
    delete m_dptr;
}